

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O0

int x509_object_cmp(X509_OBJECT *a,X509_OBJECT *b)

{
  int ret;
  X509_OBJECT *b_local;
  X509_OBJECT *a_local;
  
  a_local._4_4_ = a->type - b->type;
  if (a_local._4_4_ == 0) {
    if (a->type == 1) {
      a_local._4_4_ = X509_subject_name_cmp((X509 *)(a->data).x509,(X509 *)(b->data).x509);
    }
    else if (a->type == 2) {
      a_local._4_4_ = X509_CRL_cmp((X509_CRL *)(a->data).x509,(X509_CRL *)(b->data).x509);
    }
    else {
      a_local._4_4_ = 0;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int x509_object_cmp(const X509_OBJECT *a, const X509_OBJECT *b) {
  int ret = a->type - b->type;
  if (ret) {
    return ret;
  }
  switch (a->type) {
    case X509_LU_X509:
      return X509_subject_name_cmp(a->data.x509, b->data.x509);
    case X509_LU_CRL:
      return X509_CRL_cmp(a->data.crl, b->data.crl);
    default:
      // abort();
      return 0;
  }
}